

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O2

void __thiscall
CompileScriptException::CopyInto(CompileScriptException *this,CompileScriptException *pse)

{
  int32 iVar1;
  UINT len;
  BSTR pWVar2;
  
  ScriptException::CopyInto(&this->super_ScriptException,&pse->super_ScriptException);
  iVar1 = this->ichMinLine;
  pse->line = this->line;
  pse->ichMinLine = iVar1;
  pse->hasLineNumberInfo = this->hasLineNumberInfo;
  pWVar2 = this->bstrLine;
  if (pWVar2 != (BSTR)0x0) {
    len = SysStringLen(pWVar2);
    pWVar2 = SysAllocStringLen(pWVar2,len);
    pse->bstrLine = pWVar2;
  }
  return;
}

Assistant:

void CompileScriptException::CopyInto(CompileScriptException* pse)
{
    ScriptException::CopyInto(pse);

    pse->line = this->line;
    pse->ichMinLine = this->ichMinLine;
    pse->hasLineNumberInfo = this->hasLineNumberInfo;

    if (this->bstrLine)
    {
        pse->bstrLine = SysAllocStringLen(this->bstrLine, SysStringLen(this->bstrLine));
    }
}